

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortFactory.cpp
# Opt level: O0

BasePort * PortFactory(char *args,ostream *debugStream)

{
  bool bVar1;
  ostream *poVar2;
  PortType local_6c;
  bool local_65;
  PortType portType;
  bool fwBridge;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string IPaddr;
  EthUdpPort *pEStack_28;
  int portNumber;
  BasePort *port;
  ostream *debugStream_local;
  char *args_local;
  
  pEStack_28 = (EthUdpPort *)0x0;
  IPaddr.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"169.254.0.100",&local_51);
  std::allocator<char>::~allocator(&local_51);
  local_65 = false;
  local_6c = BasePort::DefaultPortType();
  bVar1 = BasePort::ParseOptions
                    (args,&local_6c,(int *)(IPaddr.field_2._M_local_buf + 0xc),(string *)local_50,
                     &local_65,(ostream *)&std::cerr);
  if (bVar1) {
    switch(local_6c) {
    case PORT_FIREWIRE:
      pEStack_28 = (EthUdpPort *)operator_new(0x4f8);
      FirewirePort::FirewirePort((FirewirePort *)pEStack_28,IPaddr.field_2._12_4_,debugStream);
      break;
    case PORT_ETH_UDP:
      pEStack_28 = (EthUdpPort *)operator_new(0x570);
      EthUdpPort::EthUdpPort
                (pEStack_28,IPaddr.field_2._12_4_,(string *)local_50,(bool)(local_65 & 1),
                 debugStream,(EthCallbackType)0x0);
      break;
    case PORT_ETH_RAW:
      poVar2 = std::operator<<(debugStream,
                               "PortFactory: Raw Ethernet not available (set Amp1394_HAS_PCAP in CMake)"
                              );
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      break;
    case PORT_ZYNQ_EMIO:
      poVar2 = std::operator<<(debugStream,"PortFactory: Zynq EMIO not available");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      break;
    default:
      poVar2 = std::operator<<(debugStream,"PortFactory: Unsupported port type");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    args_local = (char *)pEStack_28;
  }
  else {
    poVar2 = std::operator<<(debugStream,"PortFactory: Failed to parse option: ");
    poVar2 = std::operator<<(poVar2,args);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    args_local = (char *)0x0;
  }
  std::__cxx11::string::~string((string *)local_50);
  return (BasePort *)args_local;
}

Assistant:

BasePort * PortFactory(const char * args, std::ostream & debugStream)
{
    BasePort * port = 0;
    int portNumber = 0;
    std::string IPaddr = ETH_UDP_DEFAULT_IP;
    bool fwBridge = false;

    BasePort::PortType portType = BasePort::DefaultPortType();

    if (!BasePort::ParseOptions(args, portType, portNumber, IPaddr, fwBridge)) {
        debugStream << "PortFactory: Failed to parse option: " << args << std::endl;
        return port;
    }

    switch (portType) {

    case BasePort::PORT_FIREWIRE:
#if Amp1394_HAS_RAW1394
        port = new FirewirePort(portNumber, debugStream);
#else
        debugStream << "PortFactory: FireWire not available (set Amp1394_HAS_RAW1394 in CMake)" << std::endl;
#endif
        break;

    case BasePort::PORT_ETH_UDP:
        port = new EthUdpPort(portNumber, IPaddr, fwBridge, debugStream);
        break;
    
    case BasePort::PORT_ETH_RAW:
#if Amp1394_HAS_PCAP
        port = new EthRawPort(portNumber, fwBridge, debugStream);
#else
        debugStream << "PortFactory: Raw Ethernet not available (set Amp1394_HAS_PCAP in CMake)" << std::endl;
#endif
        break;

    case BasePort::PORT_ZYNQ_EMIO:
#if Amp1394_HAS_EMIO
        port = new ZynqEmioPort(portNumber, debugStream);
#else
        debugStream << "PortFactory: Zynq EMIO not available" << std::endl;
#endif
        break;

    default:
        debugStream << "PortFactory: Unsupported port type" << std::endl;
        break;
    }
    
    return port;
}